

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O1

Vector2 GetMonitorPosition(int monitor)

{
  Vector2 VVar1;
  GLFWmonitor **ppGVar2;
  float fVar3;
  float fVar4;
  int monitorCount;
  int y;
  int x;
  int local_1c;
  int local_18;
  int local_14;
  
  local_1c = 0;
  ppGVar2 = glfwGetMonitors(&local_1c);
  if ((monitor < 0) || (local_1c <= monitor)) {
    TraceLog(4,"GLFW: Failed to find selected monitor");
    fVar3 = 0.0;
    fVar4 = 0.0;
  }
  else {
    glfwGetMonitorPos(ppGVar2[(uint)monitor],&local_14,&local_18);
    fVar3 = (float)local_14;
    fVar4 = (float)local_18;
  }
  VVar1.y = fVar4;
  VVar1.x = fVar3;
  return VVar1;
}

Assistant:

Vector2 GetMonitorPosition(int monitor)
{
    int monitorCount = 0;
    GLFWmonitor **monitors = glfwGetMonitors(&monitorCount);

    if ((monitor >= 0) && (monitor < monitorCount))
    {
        int x, y;
        glfwGetMonitorPos(monitors[monitor], &x, &y);

        return (Vector2){ (float)x, (float)y };
    }
    else TRACELOG(LOG_WARNING, "GLFW: Failed to find selected monitor");
    return (Vector2){ 0, 0 };
}